

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

bool __thiscall Rml::DataViewAttribute::Update(DataViewAttribute *this,DataModel *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  size_type __n;
  bool bVar3;
  int iVar4;
  Element *element;
  Variant *this_00;
  String *name;
  DataExpression *this_01;
  _Alloc_hider __s1;
  String value;
  Variant variant;
  DataExpressionInterface expr_interface;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_t local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  Variant local_70;
  DataExpressionInterface local_48;
  
  Variant::Variant(&local_70);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_48,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_01 = (this->super_DataViewCommon).expression._M_t.
              super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
              .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    if (this_01 == (DataExpression *)0x0) {
      bVar3 = Assert("RMLUI_ASSERT(expression)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                     ,0x4f);
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      this_01 = (this->super_DataViewCommon).expression._M_t.
                super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    }
    bVar3 = DataExpression::Run(this_01,&local_48,&local_70);
    if (bVar3) {
      paVar1 = &local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_70,&local_b0);
      name = &(this->super_DataViewCommon).modifier;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar1) {
        local_d0.field_2._8_8_ = local_b0.field_2._8_8_;
      }
      else {
        local_d0._M_dataplus._M_p = local_b0._M_dataplus._M_p;
      }
      local_d0.field_2._M_allocated_capacity._1_7_ = local_b0.field_2._M_allocated_capacity._1_7_;
      local_d0.field_2._M_local_buf[0] = local_b0.field_2._M_local_buf[0];
      local_d0._M_string_length = local_b0._M_string_length;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      this_00 = Element::GetAttribute(element,name);
      if (this_00 == (Variant *)0x0) {
LAB_00202727:
        bVar3 = true;
        Element::SetAttribute<std::__cxx11::string>(element,name,&local_d0);
      }
      else {
        paVar1 = &local_f0.field_2;
        local_f0._M_string_length = 0;
        local_f0.field_2._M_local_buf[0] = '\0';
        local_f0._M_dataplus._M_p = (pointer)paVar1;
        Variant::
        GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (this_00,&local_f0);
        __n = local_f0._M_string_length;
        __s1._M_p = local_f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == paVar1) {
          local_80._8_8_ = local_f0.field_2._8_8_;
          __s1._M_p = (pointer)&local_80;
        }
        local_80._M_allocated_capacity._1_7_ = local_f0.field_2._M_allocated_capacity._1_7_;
        local_80._M_local_buf[0] = local_f0.field_2._M_local_buf[0];
        local_88 = local_f0._M_string_length;
        local_f0._M_string_length = 0;
        local_f0.field_2._M_local_buf[0] = '\0';
        bVar3 = true;
        local_f0._M_dataplus._M_p = (pointer)paVar1;
        local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)__s1._M_p;
        if (__n == local_d0._M_string_length) {
          if (__n == 0) {
            bVar3 = false;
          }
          else {
            iVar4 = bcmp(__s1._M_p,local_d0._M_dataplus._M_p,__n);
            bVar3 = iVar4 != 0;
          }
        }
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__s1._M_p != &local_80) &&
           (operator_delete(__s1._M_p,local_80._M_allocated_capacity + 1),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_f0._M_dataplus._M_p != paVar1)) {
          operator_delete(local_f0._M_dataplus._M_p,
                          CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                   local_f0.field_2._M_local_buf[0]) + 1);
        }
        if (bVar3) goto LAB_00202727;
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00202755;
    }
  }
  bVar3 = false;
LAB_00202755:
  Variant::~Variant(&local_70);
  return bVar3;
}

Assistant:

bool DataViewAttribute::Update(DataModel& model)
{
	const String& attribute_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const String value = variant.Get<String>();
		const Variant* attribute = element->GetAttribute(attribute_name);

		if (!attribute || attribute->Get<String>() != value)
		{
			element->SetAttribute(attribute_name, value);
			result = true;
		}
	}
	return result;
}